

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void heap_destroy(heap_t *heap)

{
  heap_chunk_t *__ptr;
  heap_chunk_t *chunk;
  heap_t *heap_local;
  
  while (heap->chunk != (heap_chunk_t *)0x0) {
    __ptr = heap->chunk;
    heap->chunk = __ptr->next;
    free(__ptr);
  }
  free(heap);
  return;
}

Assistant:

static void heap_destroy(heap_t* heap)
{
    while(heap->chunk) {
        heap_chunk_t* chunk = heap->chunk;
        heap->chunk = chunk->next;
        free(chunk);
    }

    free(heap);
}